

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O1

UINT8 calculateSum8(UINT8 *buffer,UINT32 bufferSize)

{
  UINT8 UVar1;
  ulong uVar2;
  
  if (bufferSize == 0 || buffer == (UINT8 *)0x0) {
    return '\0';
  }
  uVar2 = (ulong)bufferSize;
  UVar1 = '\0';
  do {
    UVar1 = UVar1 + buffer[uVar2 - 1];
    uVar2 = uVar2 - 1;
  } while (uVar2 != 0);
  return UVar1;
}

Assistant:

UINT8 calculateSum8(const UINT8* buffer, UINT32 bufferSize)
{
    if (!buffer)
        return 0;
    
    UINT8 counter = 0;
    
    while (bufferSize--)
        counter += buffer[bufferSize];
    
    return counter;
}